

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileManager.hpp
# Opt level: O0

int __thiscall
sjtu::FileManager<sjtu::TrainManager::stationNameType>::init
          (FileManager<sjtu::TrainManager::stationNameType> *this,EVP_PKEY_CTX *ctx)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  int iVar3;
  LRUCache<sjtu::TrainManager::stationNameType> *pLVar4;
  byte in_CL;
  ofstream outfile;
  ifstream infile;
  size_t in_stack_fffffffffffffb98;
  string *psVar5;
  LRUCache<sjtu::TrainManager::stationNameType> *in_stack_fffffffffffffba0;
  undefined1 local_430 [48];
  LRUCache<sjtu::TrainManager::stationNameType> *in_stack_fffffffffffffc00;
  undefined1 local_230 [539];
  byte local_15;
  EVP_PKEY_CTX *local_10;
  FileManager<sjtu::TrainManager::stationNameType> *local_8;
  
  local_15 = in_CL & 1;
  local_10 = ctx;
  local_8 = this;
  if (((this->super_FileManager_Base<sjtu::TrainManager::stationNameType>).cache !=
       (LRUCache<sjtu::TrainManager::stationNameType> *)0x0) &&
     (pLVar4 = (this->super_FileManager_Base<sjtu::TrainManager::stationNameType>).cache,
     pLVar4 != (LRUCache<sjtu::TrainManager::stationNameType> *)0x0)) {
    LRUCache<sjtu::TrainManager::stationNameType>::~LRUCache(in_stack_fffffffffffffc00);
    operator_delete(pLVar4,0x48);
  }
  pLVar4 = (LRUCache<sjtu::TrainManager::stationNameType> *)operator_new(0x48);
  LRUCache<sjtu::TrainManager::stationNameType>::LRUCache
            (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,(fstream *)0x127003);
  (this->super_FileManager_Base<sjtu::TrainManager::stationNameType>).cache = pLVar4;
  std::ifstream::ifstream(local_230,(string *)ctx,_S_in);
  bVar1 = std::ifstream::is_open();
  if (((bVar1 & 1) == 0) || ((local_15 & 1) != 0)) {
    (this->super_FileManager_Base<sjtu::TrainManager::stationNameType>).is_newfile = true;
    _Var2 = std::operator|(_S_out,_S_bin);
    std::ofstream::ofstream(local_430,(string *)ctx,_Var2);
    std::ofstream::close();
    std::ofstream::~ofstream(local_430);
  }
  else {
    (this->super_FileManager_Base<sjtu::TrainManager::stationNameType>).is_newfile = false;
  }
  std::ifstream::close();
  psVar5 = (string *)&(this->super_FileManager_Base<sjtu::TrainManager::stationNameType>).file;
  _Var2 = std::operator|(_S_in,_S_out);
  std::operator|(_Var2,_S_bin);
  std::fstream::open(psVar5,(_Ios_Openmode)ctx);
  iVar3 = std::ifstream::~ifstream(local_230);
  return iVar3;
}

Assistant:

virtual void init(std::string filepath , unsigned int cache_size , bool is_reset = false) override
		{
			if (cache) delete cache;
			cache = new LRUCache<T>(cache_size , file);
			std::ifstream infile(filepath , std::ios_base::in);
			if (!infile.is_open() || is_reset)
			{
				is_newfile = true;
				std::ofstream outfile(filepath , std::ios_base::out | std::ios_base::binary);
				outfile.close();
			}else is_newfile = false;
			infile.close();
			file.open(filepath , std::ios_base::in | std::ios_base::out | std::ios_base::binary);
		}